

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O0

BOOL CopyFileA(LPCSTR lpExistingFileName,LPCSTR lpNewFileName,BOOL bFailIfExists)

{
  DWORD DVar1;
  int iVar2;
  PAL_ERROR PVar3;
  BOOL BVar4;
  undefined1 *hFile;
  long in_FS_OFFSET;
  uint local_410c;
  DWORD local_4108;
  int permissions;
  DWORD bytes_written;
  DWORD bytes_read;
  char *buffer;
  char *pcStack_40f0;
  int buffer_size;
  LPSTR lpUnixPath;
  stat SrcFileStats;
  BOOL local_4050;
  DWORD dwSrcFileAttributes;
  BOOL bGood;
  DWORD dwDestCreationMode;
  HANDLE hDest;
  HANDLE hSource;
  CPalThread *pThread;
  BOOL bFailIfExists_local;
  LPCSTR lpNewFileName_local;
  LPCSTR lpExistingFileName_local;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  _bGood = &DAT_ffffffffffffffff;
  local_4050 = 0;
  pcStack_40f0 = (char *)0x0;
  buffer._4_4_ = 0x4000;
  _bytes_written = &lpExistingFileName_local;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  CorUnix::InternalGetCurrentThread();
  if (bFailIfExists == 0) {
    dwSrcFileAttributes = 2;
  }
  else {
    dwSrcFileAttributes = 1;
  }
  hFile = (undefined1 *)
          CreateFileA(lpExistingFileName,0x80000000,1,(LPSECURITY_ATTRIBUTES)0x0,3,0,(HANDLE)0x0);
  if (hFile == &DAT_ffffffffffffffff) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
  }
  else {
    SrcFileStats.__glibc_reserved[2]._4_4_ = GetFileAttributesA(lpExistingFileName);
    if (SrcFileStats.__glibc_reserved[2]._4_4_ == 0xffffffff) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
    }
    else {
      pcStack_40f0 = CorUnix::InternalStrdup(lpExistingFileName);
      if (pcStack_40f0 == (char *)0x0) {
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        DVar1 = FILEGetLastErrorFromErrno();
        CorUnix::CPalThread::SetLastError(DVar1);
      }
      else {
        FILEDosToUnixPathA(pcStack_40f0);
        iVar2 = stat64(pcStack_40f0,(stat64 *)&lpUnixPath);
        if (iVar2 == -1) {
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
          PVar3 = FILEGetLastErrorFromErrnoAndFilename(pcStack_40f0);
          CorUnix::CPalThread::SetLastError(PVar3);
        }
        else {
          _bGood = (undefined1 *)
                   CreateFileA(lpNewFileName,0x40000000,1,(LPSECURITY_ATTRIBUTES)0x0,
                               dwSrcFileAttributes,0,(HANDLE)0x0);
          if (_bGood == &DAT_ffffffffffffffff) {
            if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
              abort();
            }
          }
          else {
            CorUnix::InternalFree(pcStack_40f0);
            pcStack_40f0 = CorUnix::InternalStrdup(lpNewFileName);
            if (pcStack_40f0 == (char *)0x0) {
              if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                abort();
              }
              DVar1 = FILEGetLastErrorFromErrno();
              CorUnix::CPalThread::SetLastError(DVar1);
            }
            else {
              FILEDosToUnixPathA(pcStack_40f0);
              local_410c = 0x1ff;
              if ((SrcFileStats.__glibc_reserved[2]._4_4_ & 1) != 0) {
                local_410c = 0x16d;
              }
              iVar2 = chmod(pcStack_40f0,(uint)SrcFileStats.st_nlink & local_410c);
              if (iVar2 == -1) {
                if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                  abort();
                }
                PVar3 = FILEGetLastErrorFromErrnoAndFilename(pcStack_40f0);
                CorUnix::CPalThread::SetLastError(PVar3);
              }
              else {
                do {
                  local_4050 = ReadFile(hFile,_bytes_written,0x4000,(LPDWORD)&permissions,
                                        (LPOVERLAPPED)0x0);
                  if (local_4050 == 0 || permissions == 0) goto LAB_003ae24a;
                  BVar4 = WriteFile(_bGood,_bytes_written,permissions,&local_4108,(LPOVERLAPPED)0x0)
                  ;
                } while (BVar4 != 0 && local_4108 == permissions);
                local_4050 = 0;
LAB_003ae24a:
                if (local_4050 == 0) {
                  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                    abort();
                  }
                  BVar4 = CloseHandle(_bGood);
                  if (((BVar4 == 0) || (BVar4 = DeleteFileA(lpNewFileName), BVar4 == 0)) &&
                     ((PAL_InitializeChakraCoreCalled & 1U) == 0)) {
                    abort();
                  }
                  _bGood = &DAT_ffffffffffffffff;
                }
              }
            }
          }
        }
      }
    }
  }
  if (hFile != &DAT_ffffffffffffffff) {
    CloseHandle(hFile);
  }
  if (_bGood != &DAT_ffffffffffffffff) {
    CloseHandle(_bGood);
  }
  if (pcStack_40f0 != (char *)0x0) {
    CorUnix::InternalFree(pcStack_40f0);
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
      __stack_chk_fail();
    }
    return local_4050;
  }
  abort();
}

Assistant:

BOOL
PALAPI
CopyFileA(
      IN LPCSTR lpExistingFileName,
      IN LPCSTR lpNewFileName,
      IN BOOL bFailIfExists)
{
    CPalThread *pThread;
    HANDLE       hSource = INVALID_HANDLE_VALUE;
    HANDLE       hDest = INVALID_HANDLE_VALUE;
    DWORD        dwDestCreationMode;
    BOOL         bGood = FALSE;
    DWORD        dwSrcFileAttributes;
    struct stat  SrcFileStats;
    
    LPSTR lpUnixPath = NULL;
    const int    buffer_size = 16*1024;
    char        *buffer = (char*)alloca(buffer_size);
    DWORD        bytes_read;
    DWORD        bytes_written;
    int          permissions;


    PERF_ENTRY(CopyFileA);
    ENTRY("CopyFileA(lpExistingFileName=%p (%s), lpNewFileName=%p (%s), bFailIfExists=%d)\n",
          lpExistingFileName?lpExistingFileName:"NULL",
          lpExistingFileName?lpExistingFileName:"NULL",
          lpNewFileName?lpNewFileName:"NULL",
          lpNewFileName?lpNewFileName:"NULL", bFailIfExists);

    pThread = InternalGetCurrentThread();
    if ( bFailIfExists )
    {
        dwDestCreationMode = CREATE_NEW;
    }
    else
    {
        dwDestCreationMode = CREATE_ALWAYS;
    }
    
    hSource = CreateFileA( lpExistingFileName,
               GENERIC_READ,
               FILE_SHARE_READ,
               NULL,
               OPEN_EXISTING,
               0,
               NULL );

    if ( hSource == INVALID_HANDLE_VALUE )
    {
        ERROR("CreateFileA failed for %s\n", lpExistingFileName);
        goto done;
    }

    /* Need to preserve the file attributes */
    dwSrcFileAttributes = GetFileAttributesA(lpExistingFileName);
    if (dwSrcFileAttributes == 0xffffffff)
    {
        ERROR("GetFileAttributes failed for %s\n", lpExistingFileName);
        goto done;
    }

    /* Need to preserve the owner/group and chmod() flags */
    lpUnixPath = InternalStrdup(lpExistingFileName);
    if ( lpUnixPath == NULL )
    {
        ERROR("InternalStrdup() failed\n");
        pThread->SetLastError(FILEGetLastErrorFromErrno());
        goto done;
    }
    FILEDosToUnixPathA(lpUnixPath);
    if (stat (lpUnixPath, &SrcFileStats) == -1)
    {
        ERROR("stat() failed for %s\n", lpExistingFileName);
        pThread->SetLastError(FILEGetLastErrorFromErrnoAndFilename(lpUnixPath));
        goto done;
    }

    hDest = CreateFileA( lpNewFileName,
             GENERIC_WRITE,
             FILE_SHARE_READ,
             NULL,
             dwDestCreationMode,
             0,
             NULL );

    if ( hDest == INVALID_HANDLE_VALUE )
    {
        ERROR("CreateFileA failed for %s\n", lpNewFileName);    
        goto done;
    }

    InternalFree(lpUnixPath);
    lpUnixPath = InternalStrdup(lpNewFileName);
    if ( lpUnixPath == NULL )
    {
        ERROR("InternalStrdup() failed\n");
        pThread->SetLastError(FILEGetLastErrorFromErrno());
        goto done;
    }
    FILEDosToUnixPathA( lpUnixPath );
    
 
    // We don't set file attributes in CreateFile. The only attribute
    // that is reflected on disk in Unix is read-only, and we set that
    // here.
    permissions = (S_IRWXU | S_IRWXG | S_IRWXO);
    if ((dwSrcFileAttributes & FILE_ATTRIBUTE_READONLY) != 0)
    {
        permissions &= ~(S_IWUSR | S_IWGRP | S_IWOTH);
    }

    /* Make sure the new file has the same chmod() flags. */
    if (chmod(lpUnixPath, SrcFileStats.st_mode & permissions) == -1)
    {
        WARN ("chmod() failed to set mode 0x%x on new file\n",
              SrcFileStats.st_mode & permissions);
        pThread->SetLastError(FILEGetLastErrorFromErrnoAndFilename(lpUnixPath));
        goto done;
    }

    while( (bGood = ReadFile( hSource, buffer, buffer_size, &bytes_read, NULL ))
           && bytes_read > 0 )
    {
        bGood = ( WriteFile( hDest, buffer, bytes_read, &bytes_written, NULL )
          && bytes_written == bytes_read);
        if (!bGood) break;
    }

    if (!bGood)
    {
        ERROR("Copy failed\n");

        if ( !CloseHandle(hDest) ||
             !DeleteFileA(lpNewFileName) )
        {
            ERROR("Unable to clean up partial copy\n");
        }
        hDest = INVALID_HANDLE_VALUE;

        goto done;
    }
    
done:

    if ( hSource != INVALID_HANDLE_VALUE ) 
    {
        CloseHandle( hSource );
    }
    if ( hDest != INVALID_HANDLE_VALUE )
    {
        CloseHandle( hDest );
    }
    if (lpUnixPath) 
    {
        InternalFree(lpUnixPath);
    }

    LOGEXIT("CopyFileA returns BOOL %d\n", bGood);
    PERF_EXIT(CopyFileA);
    return bGood;
}